

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arcflow.cpp
# Opt level: O1

int __thiscall
Arcflow::min_slack(Arcflow *this,vector<int,_std::allocator<int>_> *b,int i0,int d,
                  vector<int,_std::allocator<int>_> *caps)

{
  bool bVar1;
  const_iterator __begin2;
  int *piVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  int v;
  vector<int,_std::allocator<int>_> Q;
  vector<bool,_std::allocator<bool>_> vis;
  uint local_b4;
  allocator_type local_ad;
  uint local_ac;
  vector<int,_std::allocator<int>_> local_a8;
  vector<bool,_std::allocator<bool>_> local_90;
  ulong local_68;
  Arcflow *local_60;
  long local_58;
  long local_50;
  vector<int,_std::allocator<int>_> *local_48;
  vector<int,_std::allocator<int>_> *local_40;
  ulong local_38;
  
  local_58 = (long)(caps->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish[-1];
  if (local_58 == 0) {
    iVar5 = 0;
  }
  else {
    local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (int *)0x0;
    local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (int *)0x0;
    local_b4 = local_b4 & 0xffffff00;
    local_48 = b;
    local_40 = caps;
    std::vector<bool,_std::allocator<bool>_>::vector
              (&local_90,local_58 + 1,(bool *)&local_b4,&local_ad);
    *local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
     super__Bit_iterator_base._M_p =
         *local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p | 1;
    local_b4 = 0;
    if (local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&local_a8,
                 (iterator)
                 local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(int *)&local_b4);
    }
    else {
      *local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish = 0;
      local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
    uVar11 = 0;
    if (i0 < (this->inst).nsizes) {
      local_50 = (long)d;
      lVar6 = (long)i0;
      uVar11 = 0;
      local_60 = this;
      do {
        lVar8 = *(long *)&(local_60->weights).
                          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar6].
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data;
        if (*(int *)(lVar8 + local_50 * 4) == 0) {
          uVar4 = 0;
        }
        else {
          uVar7 = (ulong)((long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start) >> 2;
          uVar4 = 5;
          if (0 < (int)(uint)uVar7) {
            local_38 = (ulong)((uint)uVar7 & 0x7fffffff);
            uVar10 = 0;
            local_68 = uVar7;
            do {
              local_b4 = local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar10];
              local_ac = 8;
              bVar1 = true;
              if (0 < (local_48->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start[lVar6]) {
                iVar5 = 0;
                do {
                  uVar7 = (long)(int)local_b4 + (long)*(int *)(lVar8 + local_50 * 4);
                  local_b4 = (uint)uVar7;
                  if ((int)(uint)local_58 < (int)local_b4) break;
                  if (local_b4 == (uint)local_58) {
                    local_ac = 1;
                    bVar1 = false;
                    goto LAB_0010b8d8;
                  }
                  uVar3 = uVar7 + 0x3f;
                  if (-1 < (long)uVar7) {
                    uVar3 = uVar7;
                  }
                  if ((local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                       [((long)uVar3 >> 6) +
                        ((ulong)((uVar7 & 0x800000000000003f) < 0x8000000000000001) - 1)] >>
                       (uVar7 & 0x3f) & 1) != 0) break;
                  if ((int)uVar11 <= (int)local_b4) {
                    uVar11 = local_b4;
                  }
                  if (local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish ==
                      local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                              ((vector<int,std::allocator<int>> *)&local_a8,
                               (iterator)
                               local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish,(int *)&local_b4);
                  }
                  else {
                    *local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish = local_b4;
                    local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish =
                         local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish + 1;
                  }
                  iVar5 = iVar5 + 1;
                } while (iVar5 < (local_48->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_start[lVar6]);
                bVar1 = true;
              }
LAB_0010b8d8:
              uVar7 = local_68;
              uVar4 = local_ac;
              if (!bVar1) goto LAB_0010b90f;
              uVar10 = uVar10 + 1;
            } while (uVar10 != local_38);
            uVar4 = 5;
          }
LAB_0010b90f:
          if (uVar4 == 5) {
            uVar4 = 0;
            iVar5 = (int)((ulong)((long)local_a8.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_a8.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start) >> 2);
            if ((int)uVar7 < iVar5) {
              lVar8 = (long)(int)uVar7;
              do {
                uVar10 = (ulong)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[lVar8];
                uVar7 = uVar10 + 0x3f;
                if (-1 < (long)uVar10) {
                  uVar7 = uVar10;
                }
                local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                ._M_start.super__Bit_iterator_base._M_p
                [((long)uVar7 >> 6) +
                 ((ulong)((uVar10 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
                     local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                     [((long)uVar7 >> 6) +
                      ((ulong)((uVar10 & 0x800000000000003f) < 0x8000000000000001) - 1)] |
                     1L << ((byte)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start[lVar8] & 0x3f);
                lVar8 = lVar8 + 1;
              } while (iVar5 != lVar8);
            }
          }
        }
        if ((uVar4 & 0xb) != 0) {
          iVar5 = 0;
          goto LAB_0010ba31;
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < (local_60->inst).nsizes);
    }
    piVar2 = (local_40->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar5 = *piVar2 - uVar11;
    if (*piVar2 < (int)uVar11) {
      iVar5 = (int)local_58 - uVar11;
      for (; piVar2 != (local_40->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_finish; piVar2 = piVar2 + 1) {
        iVar9 = -1;
        uVar7 = (long)*piVar2;
        do {
          uVar10 = uVar7 + 0x3f;
          if (-1 < (long)uVar7) {
            uVar10 = uVar7;
          }
          iVar9 = iVar9 + 1;
        } while (((local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                   [((long)uVar10 >> 6) +
                    ((ulong)((uVar7 & 0x800000000000003f) < 0x8000000000000001) - 1)] >>
                   (uVar7 & 0x3f) & 1) == 0) &&
                (bVar1 = (long)*piVar2 - (long)iVar5 <= (long)uVar7, uVar7 = uVar7 - 1, bVar1));
        if (iVar9 < iVar5) {
          iVar5 = iVar9;
        }
      }
    }
LAB_0010ba31:
    if (local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != (ulong *)0x0) {
      operator_delete(local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p = (ulong *)0x0;
      local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_offset = 0;
      local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
      .super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
      .super__Bit_iterator_base._M_offset = 0;
      local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage = (_Bit_pointer)0x0;
    }
    if (local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return iVar5;
}

Assistant:

int Arcflow::min_slack(const std::vector<int> &b, int i0, int d,
					   const std::vector<int> &caps) const {
	int C = caps.back();
	if (C == 0) {
		return 0;
	}
	std::vector<int> Q;
	std::vector<bool> vis(C + 1);
	vis[0] = true;
	Q.push_back(0);
	int res = 0;
	for (int i = i0; i < inst.nsizes; i++) {
		const int &w = weights[i][d];
		if (!w) {
			continue;
		}
		int qs = Q.size();
		for (int j = 0; j < qs; j++) {
			int u = Q[j];
			int v = u;
			for (int k = 1; k <= b[i]; k++) {
				v += w;
				if (v > C) {
					break;
				} else if (v == C) {
					return 0;
				} else if (vis[v]) {
					break;
				}
				res = std::max(res, v);
				Q.push_back(v);
			}
		}
		for (int j = qs; j < static_cast<int>(Q.size()); j++) {
			vis[Q[j]] = true;
		}
	}
	if (res <= caps[0]) {
		return caps[0] - res;
	} else {
		int mslack = C - res;
		for (int cap : caps) {
			int p = cap;
			while (!vis[p] && cap - p <= mslack) {
				p--;
			}
			mslack = std::min(mslack, cap - p);
		}
		return mslack;
	}
}